

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# showref.cpp
# Opt level: O3

bool __thiscall duckdb::ShowRef::Equals(ShowRef *this,TableRef *other_p)

{
  size_t __n;
  bool bVar1;
  int iVar2;
  ShowRef *pSVar3;
  pointer pQVar4;
  
  bVar1 = TableRef::Equals(&this->super_TableRef,other_p);
  if (bVar1) {
    pSVar3 = TableRef::Cast<duckdb::ShowRef>(other_p);
    if ((pSVar3->query).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>
        ._M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t
        .super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
        super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl !=
        (this->query).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
        _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
        super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl) {
      pQVar4 = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::
               operator->(&pSVar3->query);
      iVar2 = (*pQVar4->_vptr_QueryNode[4])
                        (pQVar4,(this->query).
                                super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>
                                ._M_t.
                                super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>
                                .super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl);
      if ((char)iVar2 == '\0') goto LAB_0125d401;
    }
    __n = (this->table_name)._M_string_length;
    if (__n == (pSVar3->table_name)._M_string_length) {
      if (__n == 0) {
        bVar1 = true;
      }
      else {
        iVar2 = bcmp((this->table_name)._M_dataplus._M_p,(pSVar3->table_name)._M_dataplus._M_p,__n);
        bVar1 = iVar2 == 0;
      }
    }
    else {
      bVar1 = false;
    }
    bVar1 = (bool)(this->show_type == pSVar3->show_type & bVar1);
  }
  else {
LAB_0125d401:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ShowRef::Equals(const TableRef &other_p) const {
	if (!TableRef::Equals(other_p)) {
		return false;
	}
	auto &other = other_p.Cast<ShowRef>();
	if (other.query.get() != query.get()) {
		if (!other.query->Equals(query.get())) {
			return false;
		}
	}
	return table_name == other.table_name && show_type == other.show_type;
}